

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Module.cpp
# Opt level: O2

void __thiscall Module::clean(Module *this)

{
  long lVar1;
  QList<QUndoStack_*> stacks;
  QArrayDataPointer<QUndoStack_*> local_30;
  
  this->mPermaDirty = false;
  if (this->mModified == true) {
    this->mModified = false;
    modifiedChanged(this,false);
  }
  QUndoGroup::stacks();
  for (lVar1 = 0; local_30.size << 3 != lVar1; lVar1 = lVar1 + 8) {
    QUndoStack::setClean();
  }
  QArrayDataPointer<QUndoStack_*>::~QArrayDataPointer(&local_30);
  return;
}

Assistant:

void Module::clean() {
    mPermaDirty = false;
    if (mModified) {
        mModified = false;
        emit modifiedChanged(false);
    }
    auto const stacks = mUndoGroup->stacks();
    for (auto stack : stacks) {
        stack->setClean();
    }
}